

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderStateQueryTests.cpp
# Opt level: O2

vector<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo>_>
* __thiscall
deqp::gles31::Functional::anon_unknown_1::CubeArraySamplerTypeCase::getInfos
          (vector<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo>_>
           *__return_storage_ptr__,CubeArraySamplerTypeCase *this)

{
  long lVar1;
  
  (__return_storage_ptr__->
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (lVar1 = 0; lVar1 != 0x60; lVar1 = lVar1 + 0x18) {
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo>_>
    ::push_back(__return_storage_ptr__,
                (value_type *)((long)&getInfos::samplerTypes[0].glType + lVar1));
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<BaseTypeCase::TestTypeInfo> CubeArraySamplerTypeCase::getInfos (void) const
{
	static const TestTypeInfo samplerTypes[] =
	{
		{ GL_SAMPLER_CUBE_MAP_ARRAY,				"uniform highp samplerCubeArray u_sampler",			"texture(u_sampler, gl_FragCoord.xxyz)"			},
		{ GL_SAMPLER_CUBE_MAP_ARRAY_SHADOW,			"uniform highp samplerCubeArrayShadow u_sampler",	"texture(u_sampler, gl_FragCoord.xxyz, 0.5)"	},
		{ GL_INT_SAMPLER_CUBE_MAP_ARRAY,			"uniform highp isamplerCubeArray u_sampler",		"texture(u_sampler, gl_FragCoord.xxyz)"			},
		{ GL_UNSIGNED_INT_SAMPLER_CUBE_MAP_ARRAY,	"uniform highp usamplerCubeArray u_sampler",		"texture(u_sampler, gl_FragCoord.xxyz)"			},
	};

	std::vector<TestTypeInfo> infos;
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(samplerTypes); ++ndx)
		infos.push_back(samplerTypes[ndx]);

	return infos;
}